

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compact_optional.cpp
# Opt level: O2

bool string_empty_value::is_empty_value(string *v)

{
  __type _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_38.field_2._M_allocated_capacity._0_2_ = 0;
  local_38._M_string_length = 2;
  local_38.field_2._M_local_buf[2] = '\0';
  _Var1 = std::operator==(v,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return _Var1;
}

Assistant:

static bool is_empty_value(const std::string& v) { return v == std::string("\0\0", 2); }